

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bwd.hh
# Opt level: O0

void tchecker::ts::prev<tchecker::syncprod::syncprod_t>
               (syncprod_t *bwd_impl,const_state_t *s,
               vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
               *v,state_status_t mask)

{
  bool bVar1;
  incoming_edges_iterator_t *piVar2;
  sync_edges_t local_308;
  incoming_edges_value_t *local_2c0;
  incoming_edges_value_t *in_edge;
  end_iterator_t __end0;
  undefined1 local_2a8 [8];
  incoming_edges_iterator_t __begin0;
  incoming_edges_range_t *__range2;
  incoming_edges_range_t in_edges;
  state_status_t mask_local;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
  *v_local;
  const_state_t *s_local;
  syncprod_t *bwd_impl_local;
  
  in_edges._316_4_ = mask;
  syncprod::syncprod_t::incoming_edges((incoming_edges_range_t *)&__range2,bwd_impl,s);
  __begin0._committed_processes_tgt.m_num_bits = (size_type)&__range2;
  piVar2 = range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>::begin
                     ((incoming_edges_range_t *)&__range2);
  syncprod::incoming_edges_iterator_t::incoming_edges_iterator_t
            ((incoming_edges_iterator_t *)local_2a8,piVar2);
  range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>::end
            ((range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t> *)
             __begin0._committed_processes_tgt.m_num_bits);
  while( true ) {
    bVar1 = syncprod::incoming_edges_iterator_t::operator!=
                      ((incoming_edges_iterator_t *)local_2a8,(end_iterator_t *)((long)&in_edge + 3)
                      );
    if (!bVar1) break;
    syncprod::incoming_edges_iterator_t::operator*
              (&local_308,(incoming_edges_iterator_t *)local_2a8);
    local_2c0 = &local_308;
    syncprod::syncprod_t::prev(bwd_impl,s,local_2c0,v,in_edges._316_4_);
    syncprod::vloc_edges_iterator_t::sync_edges_t::~sync_edges_t(&local_308);
    syncprod::incoming_edges_iterator_t::operator++((incoming_edges_iterator_t *)local_2a8);
  }
  syncprod::incoming_edges_iterator_t::~incoming_edges_iterator_t
            ((incoming_edges_iterator_t *)local_2a8);
  range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>::~range_t
            ((range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t> *)
             &__range2);
  return;
}

Assistant:

void prev(BWD_IMPL & bwd_impl, typename BWD_IMPL::const_state_t const & s, std::vector<typename BWD_IMPL::sst_t> & v,
          tchecker::state_status_t mask)
{
  typename BWD_IMPL::incoming_edges_range_t in_edges = bwd_impl.incoming_edges(s);
  for (typename BWD_IMPL::incoming_edges_value_t && in_edge : in_edges)
    bwd_impl.prev(s, in_edge, v, mask);
}